

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LowerDeleteElemI(Lowerer *this,Instr *instr,bool strictMode)

{
  LowererMD *this_00;
  IRType IVar1;
  Instr *pIVar2;
  code *pcVar3;
  bool bVar4;
  Opnd *this_01;
  undefined4 *puVar5;
  IndirOpnd *pIVar6;
  AddrOpnd *opndArg;
  IntConstOpnd *opndArg_00;
  RegOpnd *opndArg_01;
  JnHelperMethod local_34;
  
  this_01 = IR::Instr::UnlinkSrc1(instr);
  bVar4 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x26cc,"(src1->IsIndirOpnd())","Expected indirOpnd on DeleteElementI");
    if (!bVar4) goto LAB_00556f2b;
    *puVar5 = 0;
  }
  pIVar2 = instr->m_prev;
  pIVar6 = IR::Opnd::AsIndirOpnd(this_01);
  opndArg = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(pIVar6);
  if (opndArg == (AddrOpnd *)0x0) {
    pIVar6 = IR::Opnd::AsIndirOpnd(this_01);
    opndArg = IR::AddrOpnd::NewFromNumber((long)pIVar6->m_offset,this->m_func,false);
  }
  else {
    IVar1 = (opndArg->super_Opnd).m_type;
    if (IVar1 == TyInt32) {
      local_34 = HelperOp_DeleteElementI_Int32;
      goto LAB_00556e80;
    }
    if (IVar1 == TyUint32) {
      local_34 = HelperOp_DeleteElementI_UInt32;
      goto LAB_00556e80;
    }
    if (IVar1 != TyVar) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x26e4,"(indexOpnd->GetType() == TyVar)","indexOpnd->GetType() == TyVar");
      if (!bVar4) {
LAB_00556f2b:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
  }
  local_34 = HelperOp_DeleteElementI;
LAB_00556e80:
  this_00 = &this->m_lowererMD;
  opndArg_00 = IR::IntConstOpnd::New((ulong)strictMode,TyInt32,this->m_func,true);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_00->super_Opnd);
  LoadScriptContext(this,instr);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg->super_Opnd);
  pIVar6 = IR::Opnd::AsIndirOpnd(this_01);
  opndArg_01 = IR::IndirOpnd::UnlinkBaseOpnd(pIVar6);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_01->super_Opnd);
  IR::Opnd::Free(this_01,this->m_func);
  LowererMD::ChangeToHelperCall
            (this_00,instr,local_34,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerDeleteElemI(IR::Instr * instr, bool strictMode)
{
    IR::Instr *instrPrev;

    IR::Opnd *src1 = instr->UnlinkSrc1();

    AssertMsg(src1->IsIndirOpnd(), "Expected indirOpnd on DeleteElementI");

    Js::PropertyOperationFlags propertyOperationFlag = Js::PropertyOperation_None;

    if (strictMode)
    {
        propertyOperationFlag = Js::PropertyOperation_StrictMode;
    }

    instrPrev = instr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperOp_DeleteElementI;
    IR::Opnd *indexOpnd = src1->AsIndirOpnd()->UnlinkIndexOpnd();
    if (indexOpnd)
    {
        if (indexOpnd->GetType() == TyInt32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_Int32;
        }
        else if (indexOpnd->GetType() == TyUint32)
        {
            helperMethod = IR::HelperOp_DeleteElementI_UInt32;
        }
        else
        {
            Assert(indexOpnd->GetType() == TyVar);
        }
    }
    else
    {
        // No index; the offset identifies the element.
        IntConstType offset = (IntConstType)src1->AsIndirOpnd()->GetOffset();
        indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
    }

    m_lowererMD.LoadHelperArgument(instr, IR::IntConstOpnd::New((IntConstType)propertyOperationFlag, TyInt32, m_func, true));
    LoadScriptContext(instr);
    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = src1->AsIndirOpnd()->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    src1->Free(this->m_func);

    m_lowererMD.ChangeToHelperCall(instr, helperMethod);

    return instrPrev;
}